

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_matrix.cpp
# Opt level: O2

Reals __thiscall Omega_h::symms_osh2inria_dim<3>(Omega_h *this,Reals *symms)

{
  Alloc *pAVar1;
  int n;
  void *extraout_RDX;
  size_t sVar2;
  Reals RVar3;
  allocator local_61;
  type f;
  Write<double> out;
  Write<signed_char> local_30;
  
  pAVar1 = (symms->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar2 = pAVar1->size;
  }
  else {
    sVar2 = (ulong)pAVar1 >> 3;
  }
  n = divide_no_remainder<int>((int)(sVar2 >> 3),6);
  pAVar1 = (symms->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar2 = pAVar1->size;
  }
  else {
    sVar2 = (ulong)pAVar1 >> 3;
  }
  std::__cxx11::string::string((string *)&f,"",&local_61);
  Write<double>::Write(&out,(LO)(sVar2 >> 3),(string *)&f);
  std::__cxx11::string::~string((string *)&f);
  Write<double>::Write((Write<double> *)&f,&symms->write_);
  Write<double>::Write(&f.out,&out);
  parallel_for<Omega_h::symms_osh2inria_dim<3>(Omega_h::Read<double>)::_lambda(int)_1_&>(n,&f);
  Write<double>::Write(&local_30,(Write<signed_char> *)&out);
  Read<double>::Read((Read<signed_char> *)this,(Write<double> *)&local_30);
  Write<double>::~Write((Write<double> *)&local_30);
  symms_osh2inria_dim<3>(Omega_h::Read<double>)::{lambda(int)#1}::~Read((_lambda_int__1_ *)&f);
  Write<double>::~Write(&out);
  RVar3.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar3.write_.shared_alloc_;
}

Assistant:

Reals symms_osh2inria_dim(Reals symms) {
  auto n = divide_no_remainder(symms.size(), symm_ncomps(dim));
  Write<Real> out(symms.size());
  auto f = OMEGA_H_LAMBDA(LO i) {
    auto iv = get_vector<symm_ncomps(dim)>(symms, i);
    auto is = vector2symm(iv);
    auto ov = symm2vector_inria(is);
    set_vector(out, i, ov);
  };
  parallel_for(n, f);
  return out;
}